

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qslider.cpp
# Opt level: O3

int __thiscall QSliderPrivate::pixelPosToRangeValue(QSliderPrivate *this,int pos)

{
  QWidget *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  int iVar4;
  QStyle *pQVar5;
  long lVar6;
  undefined8 *puVar7;
  QStyleOptionSlider *pQVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  QStyleOptionSlider opt;
  QStyleOptionSlider QStack_b8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x8;
  puVar7 = &DAT_006dcd20;
  pQVar8 = &QStack_b8;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    *(undefined8 *)pQVar8 = *puVar7;
    puVar7 = puVar7 + 1;
    pQVar8 = (QStyleOptionSlider *)((long)pQVar8 + 8);
  }
  QStyleOptionSlider::QStyleOptionSlider(&QStack_b8);
  (**(code **)(*(long *)this_00 + 0x1a8))(this_00,&QStack_b8);
  pQVar5 = QWidget::style(this_00);
  auVar9 = (**(code **)(*(long *)pQVar5 + 0xd8))(pQVar5,3,&QStack_b8,1,this_00);
  auVar2 = auVar9._0_12_;
  pQVar5 = QWidget::style(this_00);
  auVar10 = (**(code **)(*(long *)pQVar5 + 0xd8))(pQVar5,3,&QStack_b8,2,this_00);
  auVar3 = auVar10._0_12_;
  if ((this->super_QAbstractSliderPrivate).orientation != Horizontal) {
    auVar1._8_8_ = auVar10._8_8_ >> 0x20;
    auVar1._0_8_ = auVar10._0_8_ >> 0x20;
    auVar3 = auVar1._0_12_;
    auVar10._8_8_ = auVar9._8_8_ >> 0x20;
    auVar10._0_8_ = auVar9._0_8_ >> 0x20;
    auVar2 = auVar10._0_12_;
  }
  iVar4 = QStyle::sliderValueFromPosition
                    (*(int *)&(this->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x254,
                     (this->super_QAbstractSliderPrivate).maximum,pos - auVar2._0_4_,
                     (auVar2._8_4_ + auVar3._0_4_) - (auVar3._8_4_ + auVar2._0_4_),
                     QStack_b8.upsideDown);
  QStyleOption::~QStyleOption((QStyleOption *)&QStack_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

int QSliderPrivate::pixelPosToRangeValue(int pos) const
{
    Q_Q(const QSlider);
    QStyleOptionSlider opt;
    q->initStyleOption(&opt);
    QRect gr = q->style()->subControlRect(QStyle::CC_Slider, &opt, QStyle::SC_SliderGroove, q);
    QRect sr = q->style()->subControlRect(QStyle::CC_Slider, &opt, QStyle::SC_SliderHandle, q);
    int sliderMin, sliderMax, sliderLength;

    if (orientation == Qt::Horizontal) {
        sliderLength = sr.width();
        sliderMin = gr.x();
        sliderMax = gr.right() - sliderLength + 1;
    } else {
        sliderLength = sr.height();
        sliderMin = gr.y();
        sliderMax = gr.bottom() - sliderLength + 1;
    }
    return QStyle::sliderValueFromPosition(minimum, maximum, pos - sliderMin,
                                           sliderMax - sliderMin, opt.upsideDown);
}